

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O3

string * __thiscall
libaom_examples::(anonymous_namespace)::format_depth_representation_element_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          pair<libaom_examples::DepthRepresentationElement,_bool> *element)

{
  undefined8 *puVar1;
  _anonymous_namespace_ _Var2;
  bool bVar3;
  double dVar4;
  long lVar5;
  char cVar6;
  char cVar7;
  long *plVar8;
  string *extraout_RAX;
  undefined8 *puVar9;
  string *extraout_RAX_00;
  string *psVar10;
  ulong *puVar11;
  size_type *psVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  string __str_2;
  string __str_1;
  string __str;
  string __str_3;
  ulong *local_1d0;
  uint local_1c8;
  undefined4 uStack_1c4;
  ulong local_1c0 [2];
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0 [2];
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140 [2];
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this[8] == (_anonymous_namespace_)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"absent","");
    return extraout_RAX;
  }
  dVar4 = depth_representation_element_to_double((DepthRepresentationElement *)this);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_50,vsnprintf,0x148,"%f",SUB84(dVar4,0));
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar8[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar8;
  }
  local_a8 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  _Var2 = *this;
  local_150 = local_140;
  std::__cxx11::string::_M_construct((ulong)&local_150,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_150,1,(uint)(byte)_Var2);
  uVar15 = 0xf;
  if (local_b0 != &local_a0) {
    uVar15 = local_a0;
  }
  if (uVar15 < (ulong)(local_148 + local_a8)) {
    uVar15 = 0xf;
    if (local_150 != local_140) {
      uVar15 = local_140[0];
    }
    if (uVar15 < (ulong)(local_148 + local_a8)) goto LAB_0012bf7c;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_0012bf7c:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_150);
  }
  local_130 = &local_120;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar9[3];
  }
  else {
    local_120 = *puVar1;
    local_130 = (undefined8 *)*puVar9;
  }
  local_128 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_180 = *puVar11;
    lStack_178 = plVar8[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar11;
    local_190 = (ulong *)*plVar8;
  }
  local_188 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  _Var2 = this[1];
  uVar16 = 1;
  if (9 < (byte)_Var2) {
    uVar16 = 3 - ((byte)_Var2 < 100);
  }
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,(char)uVar16);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b0,uVar16,(uint)(byte)_Var2);
  uVar15 = 0xf;
  if (local_190 != &local_180) {
    uVar15 = local_180;
  }
  if (uVar15 < (ulong)(local_1a8 + local_188)) {
    uVar15 = 0xf;
    if (local_1b0 != local_1a0) {
      uVar15 = local_1a0[0];
    }
    if (uVar15 < (ulong)(local_1a8 + local_188)) goto LAB_0012c0d6;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_0012c0d6:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_1b0);
  }
  local_110 = &local_100;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar9[3];
  }
  else {
    local_100 = *puVar1;
    local_110 = (undefined8 *)*puVar9;
  }
  local_108 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_160 = *puVar11;
    lStack_158 = plVar8[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar11;
    local_170 = (ulong *)*plVar8;
  }
  local_168 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar16 = *(uint *)(this + 4);
  cVar7 = '\x01';
  if (9 < uVar16) {
    uVar13 = uVar16;
    cVar6 = '\x04';
    do {
      cVar7 = cVar6;
      if (uVar13 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_0012c1ef;
      }
      if (uVar13 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_0012c1ef;
      }
      if (uVar13 < 10000) goto LAB_0012c1ef;
      bVar3 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar6 = cVar7 + '\x04';
    } while (bVar3);
    cVar7 = cVar7 + '\x01';
  }
LAB_0012c1ef:
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d0,local_1c8,uVar16);
  uVar15 = CONCAT44(uStack_1c4,local_1c8) + local_168;
  uVar14 = 0xf;
  if (local_170 != &local_160) {
    uVar14 = local_160;
  }
  if (uVar14 < uVar15) {
    uVar14 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar14 = local_1c0[0];
    }
    if (uVar14 < uVar15) goto LAB_0012c256;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_0012c256:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_1d0);
  }
  local_f0 = &local_e0;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_e0 = *puVar1;
    uStack_d8 = puVar9[3];
  }
  else {
    local_e0 = *puVar1;
    local_f0 = (undefined8 *)*puVar9;
  }
  local_e8 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_80 = *puVar11;
    lStack_78 = plVar8[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar11;
    local_90 = (ulong *)*plVar8;
  }
  local_88 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  _Var2 = this[2];
  uVar16 = 1;
  if (9 < (byte)_Var2) {
    uVar16 = 3 - ((byte)_Var2 < 100);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar16);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,uVar16,(uint)(byte)_Var2);
  uVar15 = 0xf;
  if (local_90 != &local_80) {
    uVar15 = local_80;
  }
  if (uVar15 < (ulong)(local_68 + local_88)) {
    uVar15 = 0xf;
    if (local_70 != local_60) {
      uVar15 = local_60[0];
    }
    if ((ulong)(local_68 + local_88) <= uVar15) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
      goto LAB_0012c3f0;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_0012c3f0:
  local_d0 = &local_c0;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar9[3];
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (undefined8 *)*puVar9;
  }
  local_c8 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar12) {
    lVar5 = plVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_150 != local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  psVar10 = (string *)&local_50.field_2;
  if ((string *)local_50._M_dataplus._M_p != psVar10) {
    operator_delete(local_50._M_dataplus._M_p);
    psVar10 = extraout_RAX_00;
  }
  return psVar10;
}

Assistant:

std::string format_depth_representation_element(
    const std::pair<DepthRepresentationElement, bool> &element) {
  if (!element.second) {
    return "absent";
  } else {
    return std::to_string(
               depth_representation_element_to_double(element.first)) +
           " (sign " + std::to_string(element.first.sign_flag) + " exponent " +
           std::to_string(element.first.exponent) + " mantissa " +
           std::to_string(element.first.mantissa) + " mantissa_len " +
           std::to_string(element.first.mantissa_len) + ")";
  }
}